

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_ecdsa_sign(mbedtls_ecp_keypair *ecp,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
              uint8_t *signature,size_t signature_size,size_t *signature_length)

{
  int ret;
  mbedtls_md_type_t md_alg;
  psa_status_t pVar1;
  uint uVar2;
  mbedtls_md_info_t *md_info;
  ulong buflen;
  mbedtls_mpi s;
  mbedtls_mpi r;
  
  buflen = (ecp->grp).pbits + 7 >> 3;
  mbedtls_mpi_init(&r);
  mbedtls_mpi_init(&s);
  ret = -0x4f00;
  if (buflen * 2 <= signature_size) {
    if ((alg >> 0x10 & 1) == 0) {
      ret = mbedtls_ecdsa_sign(&ecp->grp,&r,&s,&ecp->d,hash,hash_length,mbedtls_ctr_drbg_random,
                               &global_data.ctr_drbg);
    }
    else {
      if (((((alg & 0xffffff00 | 0x10000) == 0x10030000) ||
           ((alg & 0xfffeff00 | 0x20000) == 0x10060000)) && ((alg & 0xff) != 0)) &&
         (uVar2 = (alg & 0xff) - 3, uVar2 < 9)) {
        md_info = (mbedtls_md_info_t *)(&PTR_mbedtls_md5_info_001509d8)[uVar2];
      }
      else {
        md_info = (mbedtls_md_info_t *)0x0;
      }
      md_alg = mbedtls_md_get_type(md_info);
      ret = mbedtls_ecdsa_sign_det_ext
                      (&ecp->grp,&r,&s,&ecp->d,hash,hash_length,md_alg,mbedtls_ctr_drbg_random,
                       &global_data.ctr_drbg);
    }
    if ((ret == 0) && (ret = mbedtls_mpi_write_binary(&r,signature,buflen), ret == 0)) {
      ret = mbedtls_mpi_write_binary(&s,signature + buflen,buflen);
    }
  }
  mbedtls_mpi_free(&r);
  mbedtls_mpi_free(&s);
  if (ret == 0) {
    *signature_length = buflen * 2;
    ret = 0;
  }
  pVar1 = mbedtls_to_psa_error(ret);
  return pVar1;
}

Assistant:

static psa_status_t psa_ecdsa_sign( mbedtls_ecp_keypair *ecp,
                                    psa_algorithm_t alg,
                                    const uint8_t *hash,
                                    size_t hash_length,
                                    uint8_t *signature,
                                    size_t signature_size,
                                    size_t *signature_length )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    size_t curve_bytes = PSA_BITS_TO_BYTES( ecp->grp.pbits );
    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( signature_size < 2 * curve_bytes )
    {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    if( PSA_ALG_DSA_IS_DETERMINISTIC( alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_SIGN_GET_HASH( alg );
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
        mbedtls_md_type_t md_alg = mbedtls_md_get_type( md_info );
        MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign_det_ext( &ecp->grp, &r, &s,
                                                     &ecp->d, hash,
                                                     hash_length, md_alg,
                                                     mbedtls_ctr_drbg_random,
                                                     &global_data.ctr_drbg ) );
    }
    else
#endif /* MBEDTLS_ECDSA_DETERMINISTIC */
    {
        (void) alg;
        MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign( &ecp->grp, &r, &s, &ecp->d,
                                             hash, hash_length,
                                             mbedtls_ctr_drbg_random,
                                             &global_data.ctr_drbg ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &r,
                                               signature,
                                               curve_bytes ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &s,
                                               signature + curve_bytes,
                                               curve_bytes ) );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );
    if( ret == 0 )
        *signature_length = 2 * curve_bytes;
    return( mbedtls_to_psa_error( ret ) );
}